

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O1

IShaderResourceVariable * __thiscall
Diligent::ShaderVariableManagerGL::GetVariable(ShaderVariableManagerGL *this,Uint32 Index)

{
  Uint32 ResIndex;
  ImageBindInfo *pIVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint local_24;
  
  uVar2 = this->m_TextureOffset / 0x18;
  ResIndex = Index - uVar2;
  if (Index < uVar2) {
    pIVar1 = (ImageBindInfo *)
             GetResource<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo>(this,Index);
    ResIndex = Index;
  }
  else {
    pIVar1 = (ImageBindInfo *)0x0;
  }
  if (pIVar1 == (ImageBindInfo *)0x0) {
    uVar3 = (uint)(((ulong)this->m_ImageOffset - (ulong)this->m_TextureOffset) / 0x18);
    uVar2 = ResIndex - uVar3;
    if (ResIndex < uVar3) {
      pIVar1 = (ImageBindInfo *)
               GetResource<Diligent::ShaderVariableManagerGL::TextureBindInfo>(this,ResIndex);
      uVar2 = ResIndex;
    }
    else {
      pIVar1 = (ImageBindInfo *)0x0;
    }
    if (pIVar1 == (ImageBindInfo *)0x0) {
      uVar4 = (uint)(((ulong)this->m_StorageBufferOffset - (ulong)this->m_ImageOffset) / 0x18);
      uVar3 = uVar2 - uVar4;
      if (uVar2 < uVar4) {
        pIVar1 = GetResource<Diligent::ShaderVariableManagerGL::ImageBindInfo>(this,uVar2);
        uVar3 = uVar2;
      }
      else {
        pIVar1 = (ImageBindInfo *)0x0;
      }
      if (pIVar1 == (ImageBindInfo *)0x0) {
        if (uVar3 < (uint)(((ulong)this->m_VariableEndOffset - (ulong)this->m_StorageBufferOffset) /
                          0x18)) {
          pIVar1 = (ImageBindInfo *)
                   GetResource<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>(this,uVar3)
          ;
        }
        else {
          pIVar1 = (ImageBindInfo *)0x0;
        }
        if (pIVar1 == (ImageBindInfo *)0x0) {
          pIVar1 = (ImageBindInfo *)0x0;
          LogError<false,unsigned_int,char[32]>
                    (false,"GetVariable",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                     ,0x20f,&local_24,(char (*) [32])" is not a valid variable index.");
        }
      }
    }
  }
  return (IShaderResourceVariable *)pIVar1;
}

Assistant:

IShaderResourceVariable* ShaderVariableManagerGL::GetVariable(Uint32 Index) const
{
    ShaderVariableLocator VarLocator(*this, Index);

    if (auto* pUB = VarLocator.TryResource<UniformBuffBindInfo>(GetNumUBs()))
        return pUB;

    if (auto* pTexture = VarLocator.TryResource<TextureBindInfo>(GetNumTextures()))
        return pTexture;

    if (auto* pImage = VarLocator.TryResource<ImageBindInfo>(GetNumImages()))
        return pImage;

    if (auto* pSSBO = VarLocator.TryResource<StorageBufferBindInfo>(GetNumStorageBuffers()))
        return pSSBO;

    LOG_ERROR(Index, " is not a valid variable index.");
    return nullptr;
}